

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O2

void HU_DrawColorBar(int x,int y,int height,int playernum)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float b;
  float g;
  float r;
  float v;
  float s;
  float h;
  
  D_GetPlayerColor(playernum,&h,&s,&v,(FPlayerColorSet **)0x0);
  HSVtoRGB(&r,&g,&b,h,s,v);
  iVar2 = (int)(r * 255.0);
  if (0xfe < iVar2) {
    iVar2 = 0xff;
  }
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  iVar3 = (int)(g * 255.0);
  if (0xfe < (int)(g * 255.0)) {
    iVar3 = 0xff;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  uVar1 = 0xff;
  if ((int)(b * 255.0) < 0xff) {
    uVar1 = (int)(b * 255.0);
  }
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
            (screen,(ulong)(uint)x,y,(ulong)(uint)(CleanXfac * 0x18 + x),(ulong)(uint)(height + y),
             0xffffffffffffffff,iVar3 << 8 | iVar2 << 0x10 | uVar1 | 0xff000000);
  return;
}

Assistant:

void HU_DrawColorBar(int x, int y, int height, int playernum)
{
	float h, s, v, r, g, b;

	D_GetPlayerColor (playernum, &h, &s, &v, NULL);
	HSVtoRGB (&r, &g, &b, h, s, v);

	screen->Clear (x, y, x + 24*CleanXfac, y + height, -1,
		MAKEARGB(255,clamp(int(r*255.f),0,255),
					 clamp(int(g*255.f),0,255),
					 clamp(int(b*255.f),0,255)));
}